

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O0

void __thiscall iqxmlrpc::http::Header::set_conn_keep_alive(Header *this,bool c)

{
  char *__s;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  byte local_11;
  Header *pHStack_10;
  bool c_local;
  Header *this_local;
  
  local_11 = c;
  pHStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"connection",&local_39);
  __s = "close";
  if ((local_11 & 1) != 0) {
    __s = "keep-alive";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_71);
  set_option(this,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void Header::set_conn_keep_alive(bool c)
{
  set_option(names::connection, c ? "keep-alive" : "close");
}